

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f2c_lite.c
# Opt level: O0

integer s_cmp(char *a0,char *b0,ftnlen la,ftnlen lb)

{
  uchar *bend;
  uchar *b;
  uchar *aend;
  uchar *a;
  ftnlen lb_local;
  ftnlen la_local;
  char *b0_local;
  char *a0_local;
  
  bend = (uchar *)b0;
  aend = (uchar *)a0;
  if (lb < la) {
    for (; bend < b0 + lb; bend = bend + 1) {
      if (*aend != *bend) {
        return (uint)*aend - (uint)*bend;
      }
      aend = aend + 1;
    }
    for (; aend < a0 + la; aend = aend + 1) {
      if (*aend != ' ') {
        return *aend - 0x20;
      }
    }
  }
  else {
    for (; aend < a0 + la; aend = aend + 1) {
      if (*aend != *bend) {
        return (uint)*aend - (uint)*bend;
      }
      bend = bend + 1;
    }
    for (; bend < b0 + lb; bend = bend + 1) {
      if (*bend != ' ') {
        return 0x20 - (uint)*bend;
      }
    }
  }
  return 0;
}

Assistant:

integer
s_cmp(a0, b0, la, lb)
char *a0, *b0;
ftnlen la, lb;
#else
integer
s_cmp(char *a0, char *b0, ftnlen la, ftnlen lb)
#endif
{
    register unsigned char *a, *aend, *b, *bend;
    a = (unsigned char *) a0;
    b = (unsigned char *) b0;
    aend = a + la;
    bend = b + lb;

    if (la <= lb) {
        while (a < aend)
            if (*a != *b)
                return (*a - *b);
            else {
                ++a;
                ++b;
            }

        while (b < bend)
            if (*b != ' ')
                return (' ' - *b);
            else
                ++b;
    }